

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O0

void __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcoshId>_>
::ClipFuncGraphDomain
          (BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcoshId>_>
           *this)

{
  double *pdVar1;
  undefined8 *puVar2;
  long lVar3;
  CStringRef arg0;
  undefined8 uVar4;
  CStringRef msg;
  ulong uVar5;
  long *in_RDI;
  double dVar6;
  double *in_XMM1_Qa;
  double *ubx;
  double *lbx;
  Range rngAcc;
  FuncGraphDomain *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  FuncGraphDomain *in_stack_ffffffffffffff40;
  undefined1 local_98 [28];
  int in_stack_ffffffffffffff84;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 uVar7;
  BasicCStringRef<char> local_58 [2];
  double *in_stack_ffffffffffffffb8;
  double *in_stack_ffffffffffffffc0;
  double *in_stack_ffffffffffffffc8;
  char **in_stack_ffffffffffffffd0;
  
  dVar6 = (double)(**(code **)(*in_RDI + 0x18))();
  pdVar1 = (double *)in_RDI[2];
  arg0.data_ = (char *)(in_RDI[2] + 8);
  if ((dVar6 <= *pdVar1) && (*(double *)arg0.data_ <= (double)in_XMM1_Qa)) {
    (**(code **)(*in_RDI + 0x20))(local_98);
    FuncGraphDomain::intersect(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    uVar5 = (**(code **)(*in_RDI + 0x28))();
    if ((uVar5 & 1) != 0) {
      (**(code **)(*in_RDI + 0xf0))(in_RDI,in_RDI[2]);
    }
    in_RDI[3] = (long)*pdVar1;
    in_RDI[4] = (long)*(double *)arg0.data_;
    puVar2 = (undefined8 *)in_RDI[2];
    lVar3 = in_RDI[2];
    *(undefined8 *)(lVar3 + 0x30) = *puVar2;
    *(undefined8 *)(lVar3 + 0x38) = puVar2[1];
    *(undefined8 *)(lVar3 + 0x40) = puVar2[2];
    *(undefined8 *)(lVar3 + 0x48) = puVar2[3];
    return;
  }
  uVar7 = 1;
  uVar4 = __cxa_allocate_exception(0x18);
  fmt::BasicCStringRef<char>::BasicCStringRef
            (local_58,"PLApproximator<{}>: argument range [{}, {}] outside of the accepted [{}, {}]"
            );
  msg.data_ = (char *)(**(code **)(*in_RDI + 0x10))();
  s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0xfffffffffffffff0;
  fmt::format<char_const*,double,double,double,double>
            (arg0,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,in_XMM1_Qa);
  fmt::BasicCStringRef<char>::BasicCStringRef((BasicCStringRef<char> *)in_stack_ffffffffffffff40,s);
  Error::Error((Error *)CONCAT17(uVar7,in_stack_ffffffffffffff88),msg,in_stack_ffffffffffffff84);
  __cxa_throw(uVar4,&Error::typeinfo,Error::~Error);
}

Assistant:

virtual void ClipFuncGraphDomain() {
    auto rngAcc = GetLargestAcceptedArgumentRange();
    auto& lbx = laPrm_.grDom.lbx;
    auto& ubx = laPrm_.grDom.ubx;
    MP_ASSERT_ALWAYS(lbx >= rngAcc.lb && rngAcc.ub >= ubx,
                     fmt::format(
                       "PLApproximator<{}>: argument range "
                       "[{}, {}] outside of the accepted [{}, {}]",
                       GetConTypeName(),
                       lbx, ubx, rngAcc.lb, rngAcc.ub));
    laPrm_.grDom.intersect(GetFuncGraphDomain());
    if (IsMonotone())     // TODO in the reduced domain only
      ClipWithFunctionValues(laPrm_.grDom);
    lbx_ = lbx;
    ubx_ = ubx;
    laPrm_.grDomOut = laPrm_.grDom;        // communicate new domain
  }